

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void ext_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  long lVar1;
  byte bVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t *extraout_RDX;
  uint8_t *puVar5;
  cs_m680x_op *op;
  
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  indexed12_hdlr(MI,info,address);
  lVar4 = (ulong)*address - (ulong)info->offset;
  lVar1 = lVar4 + 1;
  if ((uint)lVar1 < info->size) {
    puVar5 = info->code;
    uVar3 = CONCAT11(puVar5[lVar4],puVar5[lVar1]);
  }
  else {
    uVar3 = 0;
    puVar5 = extraout_RDX;
  }
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_EXTENDED;
  (info->m680x).operands[bVar2].field_1.rel.address = uVar3;
  set_operand_size(info,op,(uint8_t)puVar5);
  return;
}

Assistant:

static void ext_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op0 = &m680x->operands[m680x->op_count++];
	uint16_t imm16 = 0;

	indexed12_hdlr(MI, info, address);
	read_word(info, &imm16, *address);
	op0->type = M680X_OP_EXTENDED;
	op0->ext.address = (int16_t)imm16;
	set_operand_size(info, op0, 1);
}